

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O3

int resolve_when_ctx_node
              (lyd_node *node,lys_node *schema,lyd_node **ctx_node,lyxp_node_type *ctx_node_type)

{
  lyd_node **pplVar1;
  lys_node *plVar2;
  lyd_node *plVar3;
  lys_node **pplVar4;
  ushort uVar5;
  ushort uVar6;
  uint uVar7;
  lyxp_node_type local_34;
  lys_node *plStack_30;
  lyxp_node_type node_type;
  lys_node *schema_local;
  
  plStack_30 = schema;
  resolve_when_ctx_snode(schema,&stack0xffffffffffffffd0,&local_34);
  if (local_34 == LYXP_NODE_ELEM) {
    uVar5 = 0;
    plVar3 = node;
    if (node != (lyd_node *)0x0) {
      do {
        pplVar1 = &plVar3->parent;
        uVar5 = uVar5 + 1;
        plVar3 = *pplVar1;
      } while (*pplVar1 != (lyd_node *)0x0);
    }
    uVar6 = 0;
    plVar2 = plStack_30;
    while (plVar2 != (lys_node *)0x0) {
      uVar6 = (uVar6 + 1) - (ushort)((plVar2->nodetype & 0x81bd) == LYS_UNKNOWN);
      pplVar4 = &plVar2->prev;
      if (plVar2->nodetype != LYS_AUGMENT) {
        pplVar4 = &plVar2->parent;
      }
      plVar2 = *pplVar4;
    }
    if (uVar5 < uVar6) {
      return -1;
    }
    if ((uint)uVar6 < (uint)uVar5) {
      uVar7 = 0;
      do {
        node = node->parent;
        uVar7 = uVar7 + 1;
      } while (uVar7 < (uint)uVar5 - (uint)uVar6);
    }
    if (node->schema != plStack_30) {
      return -1;
    }
  }
  else {
    do {
      pplVar1 = &node->parent;
      plVar3 = node;
      node = *pplVar1;
    } while (*pplVar1 != (lyd_node *)0x0);
    do {
      node = plVar3;
      plVar3 = node->prev;
    } while (node->prev->next != (lyd_node *)0x0);
  }
  *ctx_node = node;
  *ctx_node_type = local_34;
  return 0;
}

Assistant:

static int
resolve_when_ctx_node(struct lyd_node *node, struct lys_node *schema, struct lyd_node **ctx_node,
                      enum lyxp_node_type *ctx_node_type)
{
    struct lyd_node *parent;
    struct lys_node *sparent;
    enum lyxp_node_type node_type;
    uint16_t i, data_depth, schema_depth;

    resolve_when_ctx_snode(schema, &schema, &node_type);

    if (node_type == LYXP_NODE_ELEM) {
        /* standard element context node */
        for (parent = node, data_depth = 0; parent; parent = parent->parent, ++data_depth);
        for (sparent = schema, schema_depth = 0;
                sparent;
                sparent = (sparent->nodetype == LYS_AUGMENT ? ((struct lys_node_augment *)sparent)->target : sparent->parent)) {
            if (sparent->nodetype & (LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_ANYDATA | LYS_NOTIF | LYS_RPC)) {
                ++schema_depth;
            }
        }
        if (data_depth < schema_depth) {
            return -1;
        }

        /* find the corresponding data node */
        for (i = 0; i < data_depth - schema_depth; ++i) {
            node = node->parent;
        }
        if (node->schema != schema) {
            return -1;
        }
    } else {
        /* root context node */
        while (node->parent) {
            node = node->parent;
        }
        while (node->prev->next) {
            node = node->prev;
        }
    }

    *ctx_node = node;
    *ctx_node_type = node_type;
    return EXIT_SUCCESS;
}